

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::includeFile(Forth *this)

{
  uint uVar1;
  streambuf *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  stringstream local_208 [8];
  stringstream inStrStream;
  ostream local_1f8 [376];
  undefined1 local_80 [8];
  string fileContent;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  uint h;
  Forth *this_local;
  
  requireDStackDepth(this,1,"INCLUDE-FILE");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  f.
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = uVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"INCLUDE-FILE",&local_49);
  GetFileHandle((Forth *)local_28,(Cell)this,(string *)(ulong)uVar1,(errorCodes)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::__cxx11::string::string((string *)local_80);
  std::__cxx11::stringstream::stringstream(local_208);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_28);
  psVar2 = (streambuf *)std::fstream::rdbuf();
  std::ostream::operator<<(local_1f8,psVar2);
  std::__cxx11::stringstream::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
             &local_228);
  std::__cxx11::string::~string((string *)&local_228);
  SaveInput(this);
  setSourceId(this,f.
                   super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi._4_4_);
  setDataCell(this,this->VarOffsetBlkAddress,0);
  SetInput(this,(string *)local_80);
  this->InterpretState = InterpretSource;
  closeFile(this);
  pop(this);
  std::__cxx11::stringstream::~stringstream(local_208);
  std::__cxx11::string::~string((string *)local_80);
  std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_28);
  return;
}

Assistant:

void includeFile() {
	REQUIRE_DSTACK_DEPTH(1, "INCLUDE-FILE");

	auto h = (dStack.getTop()); // do not delete handler from stack to close file after read
	auto f = GetFileHandle(h, "INCLUDE-FILE",errorReadFile);
	/*
	std::string line;
	while (std::getline(*f, line)) {
		auto addr = PutStringToEndOfDataSpace(line);
		push(CELL(addr));
		push(static_cast<Cell>(line.length()));
		evaluate(); //@bug - should move evaluate outside of this procedure
	}
	*/
	std::string fileContent{};
	std::stringstream inStrStream{};
	inStrStream << (*f).rdbuf();   // read the file
	fileContent = inStrStream.str(); //
	SaveInput();
	setSourceId(h);
	setDataCell(VarOffsetBlkAddress, Cell(0)); // set BLK=0
	SetInput(fileContent);
	InterpretState = InterpretSource;
	// must close file according to specification
	closeFile();
	pop(); // discard error code
}